

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecClass.c
# Opt level: O0

void Cec_ManSimCompareEqualScore(uint *p0,uint *p1,int nWords,int *pScores)

{
  int iVar1;
  int local_30;
  int local_2c;
  int b;
  int w;
  int *pScores_local;
  int nWords_local;
  uint *p1_local;
  uint *p0_local;
  
  if ((*p0 & 1) == (*p1 & 1)) {
    for (local_2c = 0; local_2c < nWords; local_2c = local_2c + 1) {
      if (p0[local_2c] != p1[local_2c]) {
        for (local_30 = 0; local_30 < 0x20; local_30 = local_30 + 1) {
          if (((p0[local_2c] ^ p1[local_2c]) >> ((byte)local_30 & 0x1f) & 1) != 0) {
            iVar1 = local_2c * 0x20 + local_30;
            pScores[iVar1] = pScores[iVar1] + 1;
          }
        }
      }
    }
  }
  else {
    for (local_2c = 0; local_2c < nWords; local_2c = local_2c + 1) {
      if (p0[local_2c] != (p1[local_2c] ^ 0xffffffff)) {
        for (local_30 = 0; local_30 < 0x20; local_30 = local_30 + 1) {
          if (((p0[local_2c] ^ p1[local_2c] ^ 0xffffffff) >> ((byte)local_30 & 0x1f) & 1) != 0) {
            iVar1 = local_2c * 0x20 + local_30;
            pScores[iVar1] = pScores[iVar1] + 1;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void Cec_ManSimCompareEqualScore( unsigned * p0, unsigned * p1, int nWords, int * pScores )
{
    int w, b;
    if ( (p0[0] & 1) == (p1[0] & 1) )
    {
        for ( w = 0; w < nWords; w++ )
            if ( p0[w] != p1[w] )
                for ( b = 0; b < 32; b++ )
                    if ( ((p0[w] ^ p1[w]) >> b ) & 1 )
                        pScores[32*w + b]++;
    }
    else
    {
        for ( w = 0; w < nWords; w++ )
            if ( p0[w] != ~p1[w] )
                for ( b = 0; b < 32; b++ )
                    if ( ((p0[w] ^ ~p1[w]) >> b ) & 1 )
                        pScores[32*w + b]++;
    }
}